

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O2

void kokkosp_finalize_library(void)

{
  KokkosTools::PerfettoConnector::kokkosp_finalize_library();
  return;
}

Assistant:

void kokkosp_finalize_library() {
  std::cout << "-----------------------------------------------------------\n"
            << "KokkosP: Finalizing Perfetto Connector... " << std::endl;

  perfetto::TrackEvent::Flush();
  tracing_session->FlushBlocking();
  tracing_session->StopBlocking();

  std::cout << "Reading trace data... " << std::flush;

  std::vector<char> _trace_data{tracing_session->ReadTraceBlocking()};

  if (!_trace_data.empty()) {
    auto _fname =
        get_env("KOKKOSP_PERFETTO_OUTPUT_FILE", "kokkosp-perfetto.pftrace");

    std::ofstream _ofs{_fname};
    if (_ofs) {
      std::cout << "Writing '" << _fname << "'... " << std::flush;
      _ofs.write(&_trace_data[0], _trace_data.size());
    } else
      std::cerr << "Error opening " << _fname << std::endl;
  }

  std::cout << "Done\n"
            << "-----------------------------------------------------------"
            << std::endl;
}